

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

int Curl_pgrsDone(connectdata *conn)

{
  SessionHandle *pSVar1;
  SessionHandle *data;
  int rc;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  (pSVar1->progress).lastshow = 0;
  conn_local._4_4_ = Curl_pgrsUpdate(conn);
  if (conn_local._4_4_ == 0) {
    if ((((pSVar1->progress).flags & 0x10U) == 0) && (((pSVar1->progress).callback & 1U) == 0)) {
      curl_mfprintf((pSVar1->set).err,"\n");
    }
    (pSVar1->progress).speeder_c = 0;
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_pgrsDone(struct connectdata *conn)
{
  int rc;
  struct SessionHandle *data = conn->data;
  data->progress.lastshow=0;
  rc = Curl_pgrsUpdate(conn); /* the final (forced) update */
  if(rc)
    return rc;

  if(!(data->progress.flags & PGRS_HIDE) &&
     !data->progress.callback)
    /* only output if we don't use a progress callback and we're not
     * hidden */
    fprintf(data->set.err, "\n");

  data->progress.speeder_c = 0; /* reset the progress meter display */
  return 0;
}